

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O0

void sc_data_init(sc_data_t *sc_data)

{
  long in_RDI;
  int lg_max_lookup;
  int in_stack_00000078;
  int in_stack_0000007c;
  int in_stack_00000080;
  int in_stack_00000084;
  size_t in_stack_00000088;
  sc_data_t *in_stack_00000090;
  int in_stack_000000a0;
  
  size_classes(in_stack_00000090,in_stack_00000088,in_stack_00000084,in_stack_00000080,
               in_stack_0000007c,in_stack_00000078,in_stack_000000a0);
  *(undefined1 *)(in_RDI + 0x48) = 1;
  return;
}

Assistant:

void
sc_data_init(sc_data_t *sc_data) {
	assert(!sc_data->initialized);

	int lg_max_lookup = 12;

	size_classes(sc_data, LG_SIZEOF_PTR, LG_QUANTUM, SC_LG_TINY_MIN,
	    lg_max_lookup, LG_PAGE, 2);

	sc_data->initialized = true;
}